

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O1

void __thiscall
Js::JavascriptPromiseReaction::JavascriptPromiseReaction
          (JavascriptPromiseReaction *this,JavascriptPromiseCapability *capabilities,
          RecyclableObject *handler)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01545418;
  Memory::Recycler::WBSetBit((char *)&this->capabilities);
  (this->capabilities).ptr = capabilities;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->capabilities);
  Memory::Recycler::WBSetBit((char *)&this->handler);
  (this->handler).ptr = handler;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->handler);
  return;
}

Assistant:

JavascriptPromiseReaction(JavascriptPromiseCapability* capabilities, RecyclableObject* handler)
            : capabilities(capabilities), handler(handler)
        { }